

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.cpp
# Opt level: O3

O3DGCErrorCode o3dgc::SaveBinData(Vector<long> *data,BinaryStream *bstream)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  uchar local_3a;
  byte local_39;
  unsigned_long local_38;
  
  local_38 = (bstream->m_stream).m_size;
  lVar4 = 5;
  do {
    local_3a = '\0';
    Vector<unsigned_char>::PushBack(&bstream->m_stream,&local_3a);
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  uVar1 = data->m_size;
  lVar4 = 5;
  uVar5 = uVar1;
  do {
    local_39 = (byte)uVar5 & 0x7f;
    Vector<unsigned_char>::PushBack(&bstream->m_stream,&local_39);
    uVar5 = uVar5 >> 7;
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  if (uVar1 != 0) {
    lVar4 = 0;
    do {
      lVar2 = 0;
      uVar5 = 0;
      do {
        lVar2 = (data->m_buffer[lVar4 + uVar5] << ((byte)uVar5 & 0x3f)) + lVar2;
        uVar6 = lVar4 + uVar5 + 1;
        uVar3 = uVar5 + 1;
        if (5 < uVar5) break;
        uVar5 = uVar3;
      } while (uVar6 < uVar1);
      BinaryStream::WriteUCharASCII(bstream,(uchar)lVar2);
      lVar4 = lVar4 + uVar3;
    } while (uVar6 < uVar1);
  }
  BinaryStream::WriteUInt32ASCII(bstream,local_38,(bstream->m_stream).m_size - local_38);
  return O3DGC_OK;
}

Assistant:

O3DGCErrorCode    SaveBinData(const Vector<long> & data,
                                  BinaryStream & bstream) 
    {
        unsigned long start = bstream.GetSize();
        bstream.WriteUInt32ASCII(0);
        const unsigned long size = data.GetSize();
        long symbol;
        bstream.WriteUInt32ASCII(size);
        for(unsigned long i = 0; i < size; )
        {
            symbol = 0;
            for(unsigned long h = 0; h < O3DGC_BINARY_STREAM_BITS_PER_SYMBOL0 && i < size; ++h)
            {
                symbol += (data[i] << h);
                ++i;
            }
            bstream.WriteUCharASCII((unsigned char) symbol);
        }
        bstream.WriteUInt32ASCII(start, bstream.GetSize() - start);
        return O3DGC_OK;
    }